

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.h
# Opt level: O2

void testing::internal::ContainerPrinter::
     PrintValue<std::multiset<unsigned_char,std::less<unsigned_char>,std::allocator<unsigned_char>>,void>
               (multiset<unsigned_char,_std::less<unsigned_char>,_std::allocator<unsigned_char>_>
                *container,ostream *os)

{
  _Base_ptr p_Var1;
  long lVar2;
  
  std::operator<<(os,'{');
  p_Var1 = (container->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  lVar2 = 0;
  do {
    if ((_Rb_tree_header *)p_Var1 == &(container->_M_t)._M_impl.super__Rb_tree_header) {
      if (lVar2 != 0) {
LAB_001d4272:
        std::operator<<(os,' ');
      }
      std::operator<<(os,'}');
      return;
    }
    if ((lVar2 != 0) && (std::operator<<(os,','), lVar2 == 0x20)) {
      std::operator<<(os," ...");
      goto LAB_001d4272;
    }
    std::operator<<(os,' ');
    UniversalPrinter<unsigned_char>::Print((uchar *)(p_Var1 + 1),os);
    lVar2 = lVar2 + 1;
    p_Var1 = (_Base_ptr)std::_Rb_tree_increment(p_Var1);
  } while( true );
}

Assistant:

static void PrintValue(const T& container, std::ostream* os) {
    const size_t kMaxCount = 32;  // The maximum number of elements to print.
    *os << '{';
    size_t count = 0;
    for (auto&& elem : container) {
      if (count > 0) {
        *os << ',';
        if (count == kMaxCount) {  // Enough has been printed.
          *os << " ...";
          break;
        }
      }
      *os << ' ';
      // We cannot call PrintTo(elem, os) here as PrintTo() doesn't
      // handle `elem` being a native array.
      internal::UniversalPrint(elem, os);
      ++count;
    }

    if (count > 0) {
      *os << ' ';
    }
    *os << '}';
  }